

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1d_api.c
# Opt level: O1

MPP_RET av1d_prepare(void *ctx,MppPacket pkt,HalDecTask *task)

{
  Av1UnitFragment *frag;
  AV1Context *ctx_00;
  MppPacket s;
  RK_U32 RVar1;
  uint length;
  uint uVar2;
  MPP_RET MVar3;
  RK_U8 *data;
  size_t sVar4;
  size_t sVar5;
  uint size;
  RK_S32 out_size;
  size_t local_50;
  ulong local_48;
  RK_S64 local_40;
  RK_U8 *out_data;
  
  ctx_00 = *ctx;
  out_data = (RK_U8 *)0x0;
  out_size = -1;
  task->valid = 0;
  *(undefined4 *)((long)ctx + 0xce4) = 0;
  local_50 = mpp_packet_get_pts(pkt);
  local_40 = mpp_packet_get_dts(pkt);
  data = (RK_U8 *)mpp_packet_get_pos(pkt);
  sVar4 = mpp_packet_get_length(pkt);
  RVar1 = mpp_packet_get_flag(pkt);
  size = (uint)sVar4;
  if ((RVar1 & 2) == 0) {
    length = av1d_split_frame((Av1CodecContext *)ctx,&out_data,&out_size,data,size);
    uVar2 = length;
    if ((int)length < 0) {
      uVar2 = size;
    }
    mpp_packet_set_pos(pkt,data + (int)uVar2);
    mpp_packet_set_length(pkt,(long)(int)(size - length));
    sVar5 = mpp_packet_get_length(pkt);
    if (sVar5 == 0) {
      RVar1 = mpp_packet_get_eos(pkt);
      *(RK_U32 *)((long)ctx + 0xcf8) = RVar1;
    }
    if (((byte)av1d_debug & 8) != 0) {
      local_48 = (ulong)(uint)out_size;
      _mpp_log_l(4,"av1d_api","pkt_len=%d, pts=%lld , out_size %d consumed %d new frame %d eos %d\n"
                 ,"av1d_prepare",sVar4 & 0xffffffff,local_50,local_48,(ulong)length,
                 (ulong)*(uint *)((long)ctx + 0xce4),(ulong)*(uint *)((long)ctx + 0xcf8));
    }
    if (out_size < 1) {
      task->valid = 0;
      if (*(int *)((long)ctx + 0xcf8) != 0) {
        task->input_packet = *(MppPacket *)((long)ctx + 0x38);
      }
    }
    else {
      av1d_get_frame_stream((Av1CodecContext *)ctx,data,length);
      s = *(MppPacket *)((long)ctx + 0x38);
      task->input_packet = s;
      mpp_packet_set_pts(s,local_50);
      mpp_packet_set_dts(*(MppPacket *)((long)ctx + 0x38),local_40);
    }
    if ((*(int *)((long)ctx + 0xcf8) != 0) && (sVar4 = mpp_packet_get_length(pkt), sVar4 == 0)) {
      (task->flags).val =
           (task->flags).val & 0xfffffffffffffffe | (ulong)(*(uint *)((long)ctx + 0xcf8) & 1);
    }
    if ((*(int *)((long)ctx + 0xce4) != 0) || (MVar3 = MPP_OK, ((ulong)task->flags & 1) != 0)) {
      if (*(int *)((long)ctx + 0xcf4) != 0) {
        task->valid = 1;
      }
      *(undefined4 *)((long)ctx + 0xcf4) = 0;
      MVar3 = MPP_OK;
    }
  }
  else {
    ctx_00->extra_has_frame = 0;
    frag = &ctx_00->current_obu;
    (ctx_00->current_obu).data = data;
    local_50 = (size_t)(int)size;
    (ctx_00->current_obu).data_size = local_50;
    MVar3 = mpp_av1_split_fragment(ctx_00,frag,1);
    if ((MPP_NOK < MVar3) && (MVar3 = mpp_av1_read_fragment_content(ctx_00,frag), MPP_NOK < MVar3))
    {
      if (ctx_00->sequence_header != (AV1RawSequenceHeader *)0x0) {
        MVar3 = mpp_av1_set_context_with_sequence((Av1CodecContext *)ctx,ctx_00->sequence_header);
      }
      mpp_packet_set_pos(pkt,data + local_50);
      mpp_av1_fragment_reset(frag);
    }
  }
  return MVar3;
}

Assistant:

MPP_RET av1d_prepare(void *ctx, MppPacket pkt, HalDecTask *task)
{
    MPP_RET ret = MPP_OK;
    Av1CodecContext *av1_ctx = (Av1CodecContext *)ctx;
    AV1Context *s = (AV1Context *)av1_ctx->priv_data;
    RK_S64 pts = -1;
    RK_S64 dts = -1;
    RK_U8 *buf = NULL;
    RK_S32 length = 0;
    RK_U8 *out_data = NULL;
    RK_S32 out_size = -1;
    RK_S32 consumed = 0;
    RK_U8 *pos = NULL;
    RK_U32 need_split = s->cfg->base.split_parse;

    need_split = 1;
    task->valid = 0;
    av1_ctx->new_frame = 0;

    pts = mpp_packet_get_pts(pkt);
    dts = mpp_packet_get_dts(pkt);
    buf = pos = mpp_packet_get_pos(pkt);
    length = (RK_S32)mpp_packet_get_length(pkt);
    if (mpp_packet_get_flag(pkt)& MPP_PACKET_FLAG_EXTRA_DATA) {
        s->extra_has_frame = 0;
        task = NULL;
        s->current_obu.data = buf;
        s->current_obu.data_size = length;
        ret = mpp_av1_split_fragment(s, &s->current_obu, 1);
        if (ret < 0) {
            return ret;
        }
        ret = mpp_av1_read_fragment_content(s, &s->current_obu);
        if (ret < 0) {
            return ret;
        }
        if (!s->sequence_header) {
            goto end;
        }
        ret = mpp_av1_set_context_with_sequence(av1_ctx, s->sequence_header);
    end:
        pos = buf + length;
        mpp_packet_set_pos(pkt, pos);
        mpp_av1_fragment_reset(&s->current_obu);
        return ret;
    }

    if (need_split) {
        consumed = av1d_split_frame(av1_ctx, &out_data, &out_size, buf, length);
    } else {
        out_size = consumed = length;
        av1_ctx->new_frame = 1;
    }

    pos += (consumed >= 0) ? consumed : length;

    mpp_packet_set_pos(pkt, pos);
    mpp_packet_set_length(pkt, length - consumed);
    if (!mpp_packet_get_length(pkt))
        av1_ctx->eos = mpp_packet_get_eos(pkt);
    av1d_dbg(AV1D_DBG_STRMIN, "pkt_len=%d, pts=%lld , out_size %d consumed %d new frame %d eos %d\n",
             length, pts, out_size, consumed, av1_ctx->new_frame, av1_ctx->eos);
    if (out_size > 0) {
        av1d_get_frame_stream(av1_ctx, buf, consumed);
        task->input_packet = av1_ctx->pkt;
        mpp_packet_set_pts(av1_ctx->pkt, pts);
        mpp_packet_set_dts(av1_ctx->pkt, dts);
    } else {
        task->valid = 0;
        if (av1_ctx->eos)
            task->input_packet = av1_ctx->pkt;
    }
    if (av1_ctx->eos && !mpp_packet_get_length(pkt))
        task->flags.eos = av1_ctx->eos;

    if (av1_ctx->new_frame || (task->flags.eos)) {
        if (av1_ctx->stream_offset > 0)
            task->valid = 1;
        av1_ctx->stream_offset = 0;
    }

    (void)pts;
    (void)dts;
    (void)task;
    return ret = MPP_OK;
}